

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo;
  uint32_t uVar4;
  DecodeStatus DVar5;
  uint Rd;
  uint inc;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  DVar5 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&Rm,DVar5);
  if (_Var1) {
    DVar5 = DecodeDPRRegisterClass(pMStack_18,RegNo + uVar4 + 1 & 0x1f,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar5);
    if (_Var1) {
      DVar5 = DecodeDPRRegisterClass
                        (pMStack_18,RegNo + (uVar4 + 1) * 2 & 0x1f,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar5);
      if (_Var1) {
        if (uVar3 != 0xf) {
          DVar5 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
          _Var1 = Check(&Rm,DVar5);
          if (!_Var1) {
            return MCDisassembler_Fail;
          }
        }
        DVar5 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
        _Var1 = Check(&Rm,DVar5);
        if (_Var1) {
          MCOperand_CreateImm0(pMStack_18,0);
          if (uVar3 == 0xd) {
            MCOperand_CreateReg0(pMStack_18,0);
          }
          else if (uVar3 != 0xf) {
            DVar5 = DecodeGPRRegisterClass(pMStack_18,uVar3,(uint64_t)Decoder_local,_Rn);
            _Var1 = Check(&Rm,DVar5);
            if (!_Var1) {
              return MCDisassembler_Fail;
            }
          }
          Inst_local._4_4_ = Rm;
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, inc;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 0);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}